

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosString.cpp
# Opt level: O3

string * adios2::helper::FileToString(string *__return_storage_ptr__,string *fileName,string *hint)

{
  long *plVar1;
  long *plVar2;
  size_type *psVar3;
  ostringstream fileSS;
  ifstream fileStream;
  long *local_450;
  long local_448;
  long local_440;
  long lStack_438;
  string local_430;
  string local_410;
  string local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  string local_3b0 [3];
  ios_base local_340 [264];
  long local_238 [2];
  streambuf local_228 [16];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(string *)fileName,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"Helper","");
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"adiosString","");
    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"FileToString","");
    std::operator+(&local_3d0,"file ",fileName);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_3d0);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_440 = *plVar2;
      lStack_438 = plVar1[3];
      local_450 = &local_440;
    }
    else {
      local_440 = *plVar2;
      local_450 = (long *)*plVar1;
    }
    local_448 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_450,(ulong)(hint->_M_dataplus)._M_p);
    psVar3 = (size_type *)(plVar1 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar1 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3) {
      local_430.field_2._M_allocated_capacity = *psVar3;
      local_430.field_2._8_8_ = plVar1[3];
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
    }
    else {
      local_430.field_2._M_allocated_capacity = *psVar3;
      local_430._M_dataplus._M_p = (pointer)*plVar1;
    }
    local_430._M_string_length = plVar1[1];
    *plVar1 = (long)psVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    Throw<std::ios_base::failure[abi:cxx11]>(local_3b0,&local_3f0,&local_410,&local_430,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p);
    }
    if (local_450 != &local_440) {
      operator_delete(local_450);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
      operator_delete(local_3d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
      operator_delete(local_3b0[0]._M_dataplus._M_p);
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
  std::ostream::operator<<(local_3b0,local_228);
  std::ifstream::close();
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
  std::ios_base::~ios_base(local_340);
  std::ifstream::~ifstream(local_238);
  return __return_storage_ptr__;
}

Assistant:

std::string FileToString(const std::string &fileName, const std::string hint)
{
    std::ifstream fileStream(fileName);

    if (!fileStream)
    {
        helper::Throw<std::ios_base::failure>("Helper", "adiosString", "FileToString",
                                              "file " + fileName + " not found, " + hint);
    }

    std::ostringstream fileSS;
    fileSS << fileStream.rdbuf();
    fileStream.close();
    return fileSS.str();
}